

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

int __thiscall problem_parser::get_variable(problem_parser *this,string_view value)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  local_30;
  const_iterator it;
  problem_parser *this_local;
  string_view value_local;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (problem_parser *)value._M_len;
  it.
  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
             )(_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
               )this;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::find(&this->m_cache_variable,(key_type *)&this_local);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
       ::end(&this->m_cache_variable);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    value_local._M_str._4_4_ = -1;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_false,_true>
                           *)&local_30);
    value_local._M_str._4_4_ = pvVar2->second;
  }
  return value_local._M_str._4_4_;
}

Assistant:

int get_variable(const std::string_view value) const noexcept
    {
        if (auto it = m_cache_variable.find(value);
            it != m_cache_variable.end())
            return it->second;

        return -1;
    }